

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int gen_publickey_from_rsa_evp
              (LIBSSH2_SESSION *session,uchar **method,size_t *method_len,uchar **pubkeydata,
              size_t *pubkeydata_len,EVP_PKEY *pk)

{
  uchar **ppuVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  uint uVar6;
  uchar *buf;
  BIGNUM *n;
  BIGNUM *e;
  BIGNUM *local_60;
  uchar *local_58;
  uchar **local_50;
  BIGNUM *local_48;
  size_t *local_40;
  size_t *local_38;
  
  puVar5 = (uchar *)(*session->alloc)(7,&session->abstract);
  if (puVar5 != (uchar *)0x0) {
    buf = (uchar *)0x0;
    local_48 = (BIGNUM *)0x0;
    local_60 = (BIGNUM *)0x0;
    local_58 = puVar5;
    local_50 = method;
    local_40 = pubkeydata_len;
    local_38 = method_len;
    EVP_PKEY_get_bn_param(pk,"e",&local_48);
    EVP_PKEY_get_bn_param(pk,"n",&local_60);
    ppuVar1 = local_50;
    if ((local_48 != (BIGNUM *)0x0) && (buf = (uchar *)0x0, local_60 != (BIGNUM *)0x0)) {
      iVar2 = BN_num_bits(local_48);
      iVar4 = iVar2 + 0xe;
      if (-1 < iVar2 + 7) {
        iVar4 = iVar2 + 7;
      }
      iVar3 = BN_num_bits(local_60);
      iVar2 = iVar3 + 0xe;
      if (-1 < iVar3 + 7) {
        iVar2 = iVar3 + 7;
      }
      uVar6 = iVar2 >> 3;
      pk = (EVP_PKEY *)(ulong)uVar6;
      buf = (uchar *)(*session->alloc)((long)(int)(uVar6 + (iVar4 >> 3) + 0x15),&session->abstract);
      if (buf == (uchar *)0x0) {
        buf = (uchar *)0x0;
      }
      else {
        _libssh2_htonu32(buf,7);
        builtin_memcpy(buf + 4,"ssh-rsa",7);
        puVar5 = write_bn(buf + 0xb,(BIGNUM *)local_48,(iVar4 >> 3) + 1);
        puVar5 = write_bn(puVar5,(BIGNUM *)local_60,uVar6 + 1);
        pk = (EVP_PKEY *)(puVar5 + -(long)buf);
      }
    }
    BN_clear_free(local_48);
    BN_clear_free(local_60);
    if (buf != (uchar *)0x0) {
      builtin_memcpy(local_58,"ssh-rsa",7);
      *ppuVar1 = local_58;
      if (local_38 != (size_t *)0x0) {
        *local_38 = 7;
      }
      *pubkeydata = buf;
      if (local_40 == (size_t *)0x0) {
        return 0;
      }
      *local_40 = (size_t)pk;
      return 0;
    }
    (*session->free)(local_58,&session->abstract);
  }
  iVar4 = _libssh2_error(session,-6,"Unable to allocate memory for private key data");
  return iVar4;
}

Assistant:

static int
gen_publickey_from_rsa_evp(LIBSSH2_SESSION *session,
                           unsigned char **method,
                           size_t *method_len,
                           unsigned char **pubkeydata,
                           size_t *pubkeydata_len,
                           EVP_PKEY *pk)
{
    libssh2_rsa_ctx* rsa = NULL;
    unsigned char *key;
    unsigned char *method_buf = NULL;
    size_t  key_len;

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing public key from RSA private key envelope"));

#ifdef USE_OPENSSL_3
    rsa = pk;
#else
    rsa = EVP_PKEY_get1_RSA(pk);
#endif
    if(!rsa) {
        /* Assume memory allocation error... what else could it be ? */
        goto __alloc_error;
    }

    method_buf = LIBSSH2_ALLOC(session, 7);  /* ssh-rsa. */
    if(!method_buf) {
        goto __alloc_error;
    }

    key = gen_publickey_from_rsa(session, rsa, &key_len);
    if(!key) {
        goto __alloc_error;
    }
#ifndef USE_OPENSSL_3
    RSA_free(rsa);
#endif

    memcpy(method_buf, "ssh-rsa", 7);
    *method = method_buf;
    if(method_len) {
        *method_len = 7;
    }
    *pubkeydata = key;
    if(pubkeydata_len) {
        *pubkeydata_len = key_len;
    }
    return 0;

__alloc_error:
#ifndef USE_OPENSSL_3
    if(rsa) {
        RSA_free(rsa);
    }
#endif
    if(method_buf) {
        LIBSSH2_FREE(session, method_buf);
    }

    return _libssh2_error(session,
                          LIBSSH2_ERROR_ALLOC,
                          "Unable to allocate memory for private key data");
}